

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

void e2e_fdb_set_person(storage_t *st,person_t *p)

{
  bool bVar1;
  fdb_status fVar2;
  char *valuelen;
  idx_prams_t *idxp;
  char *in_RSI;
  long in_RDI;
  byte bVar3;
  bool existed;
  bool indexed;
  fdb_doc *doc;
  fdb_status status;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *in_stack_ffffffffffffff60;
  person_t *p_00;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  fdb_doc **in_stack_ffffffffffffff78;
  char *value;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  fdb_doc *doc_00;
  undefined4 in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  storage_t *in_stack_ffffffffffffffe0;
  __suseconds_t local_18;
  tx_type_t tStack_12;
  
  gettimeofday((timeval *)&stack0xffffffffffffffe0,(__timezone_ptr_t)0x0);
  doc_00 = (fdb_doc *)0x0;
  strcpy(in_RSI + 0xe00,(char *)(in_RDI + 0x48));
  value = in_RSI;
  strlen(in_RSI);
  fdb_doc_create(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60,0xe0c,(void *)0x109cef,(size_t)doc_00);
  fVar2 = fdb_get(*(fdb_kvs_handle **)(in_RDI + 8),doc_00);
  bVar3 = fVar2 == FDB_RESULT_SUCCESS;
  fVar2 = fdb_set(*(fdb_kvs_handle **)(in_RDI + 8),doc_00);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0xcd);
    e2e_fdb_set_person::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0xcd,"void e2e_fdb_set_person(storage_t *, person_t *)");
    }
    fVar2 = FDB_RESULT_SUCCESS;
  }
  valuelen = in_RSI + 0x400;
  strlen(in_RSI + 0x400);
  fVar2 = fdb_set_kv((fdb_kvs_handle *)CONCAT44(fVar2,in_stack_ffffffffffffff98),doc_00,
                     CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(bVar3,in_stack_ffffffffffffff88)),
                     value,(size_t)valuelen);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0xd1);
    e2e_fdb_set_person::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0xd1,"void e2e_fdb_set_person(storage_t *, person_t *)");
    }
    fVar2 = FDB_RESULT_SUCCESS;
  }
  p_00 = *(person_t **)(in_RDI + 0x18);
  idxp = (idx_prams_t *)(in_RSI + 0x400);
  strlen(in_RSI + 0x400);
  fVar2 = fdb_set_kv((fdb_kvs_handle *)CONCAT44(fVar2,in_stack_ffffffffffffff98),doc_00,
                     CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(bVar3,in_stack_ffffffffffffff88)),
                     value,(size_t)valuelen);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0xd6);
    e2e_fdb_set_person::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0xd6,"void e2e_fdb_set_person(storage_t *, person_t *)");
    }
  }
  save_tx(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,tStack_12);
  if ((bVar3 & 1) == 0) {
    bVar1 = is_indexed(idxp,p_00);
    if (bVar1) {
      *(int *)(*(long *)(in_RDI + 0x38) + 0x404) = *(int *)(*(long *)(in_RDI + 0x38) + 0x404) + 1;
      *(int *)(*(long *)(in_RDI + 0x38) + 0x408) =
           *(int *)(in_RSI + 0xe08) + *(int *)(*(long *)(in_RDI + 0x38) + 0x408);
      free(doc_00->body);
      doc_00->body = (void *)0x0;
      if (((*(byte *)(in_RDI + 0x4f) & 1) != 0) &&
         (fVar2 = fdb_get(*(fdb_kvs_handle **)(in_RDI + 8),doc_00), fVar2 != FDB_RESULT_SUCCESS)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                ,0xe5);
        e2e_fdb_set_person::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                        ,0xe5,"void e2e_fdb_set_person(storage_t *, person_t *)");
        }
      }
    }
    *(int *)(*(long *)(in_RDI + 0x38) + 0x400) = *(int *)(*(long *)(in_RDI + 0x38) + 0x400) + 1;
  }
  fdb_doc_free((fdb_doc *)0x10a074);
  return;
}

Assistant:

void e2e_fdb_set_person(storage_t *st, person_t *p){

    TEST_INIT();
    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    strcpy(p->keyspace, st->keyspace);
    fdb_doc_create(&doc, p->key, strlen(p->key),
                   NULL, 0, (void *)p, sizeof(person_t));
    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_set(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_set_kv(st->index1, p->name, strlen(p->name), doc->key, doc->keylen);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_set_kv(st->index2, p->name, strlen(p->name), (void *)&p->age,
                        sizeof(int));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, SET_PERSON);

    if(!existed){  // new doc
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed++;
            st->v_chk->sum_age_indexed+=p->age;
            free(doc->body);
            doc->body = NULL;
            if (st->verify_set) {
                status = fdb_get(st->all_docs, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
            }
        }
        st->v_chk->ndocs += 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}